

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnAtomicLoadExpr
          (BinaryReaderInterp *this,Opcode opcode,uint32_t align_log2,Address offset)

{
  Istream *this_00;
  bool bVar1;
  uint32_t alignment;
  Result result;
  Enum op;
  Address offset_local;
  uint32_t align_log2_local;
  BinaryReaderInterp *this_local;
  Opcode opcode_local;
  
  this_local._0_4_ = opcode.enum_;
  alignment = GetAlignment(align_log2);
  result = SharedValidator::OnAtomicLoad
                     (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                      opcode,alignment);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_00 = this->istream_;
    op = Opcode::operator_cast_to_Enum((Opcode *)&this_local);
    Istream::Emit(this_00,op,0,offset);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnAtomicLoadExpr(Opcode opcode,
                                            uint32_t align_log2,
                                            Address offset) {
  CHECK_RESULT(validator_.OnAtomicLoad(loc, opcode, GetAlignment(align_log2)));
  istream_.Emit(opcode, kMemoryIndex0, offset);
  return Result::Ok;
}